

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::logAssertNothrow(bool threw,char *expr,Enum assert_type,char *file,int line)

{
  bool bVar1;
  char *pcVar2;
  Code code;
  String local_c78;
  String local_c70;
  String local_c68;
  String local_c60;
  String local_c58;
  Color local_c4e;
  Color local_c4d [7];
  Color col_2;
  Color col_1;
  Color local_c39;
  char local_c38 [7];
  Color col;
  char info1 [1024];
  char msg [1024];
  char loc [1024];
  int line_local;
  char *file_local;
  Enum assert_type_local;
  char *expr_local;
  bool threw_local;
  
  pcVar2 = fileForOutput(file);
  snprintf(msg + 0x3f8,0x400,"%s(%d)",pcVar2,(ulong)(uint)line);
  if (threw) {
    snprintf(info1 + 0x3f8,0x400," FAILED!\n");
  }
  else {
    snprintf(info1 + 0x3f8,0x400," PASSED!\n");
  }
  pcVar2 = getAssertString(assert_type);
  snprintf(local_c38,0x400,"  %s( %s )\n\n",pcVar2,expr);
  do {
    if (msg[0x3f8] != '\0') {
      Color::Color(&local_c39,LightGrey);
      printf("%s",msg + 0x3f8);
      Color::~Color(&local_c39);
    }
    bVar1 = always_false();
  } while (bVar1);
  do {
    if (info1[0x3f8] != '\0') {
      code = BrightGreen;
      if (threw) {
        code = Red;
      }
      Color::Color(local_c4d,code);
      printf("%s",info1 + 0x3f8);
      Color::~Color(local_c4d);
    }
    bVar1 = always_false();
  } while (bVar1);
  do {
    if (local_c38[0] != '\0') {
      Color::Color(&local_c4e,Cyan);
      printf("%s",local_c38);
      Color::~Color(&local_c4e);
    }
    bVar1 = always_false();
  } while (bVar1);
  String::String(&local_c68,msg + 0x3f8);
  String::String(&local_c70,info1 + 0x3f8);
  String::operator+(&local_c60,&local_c68);
  String::String(&local_c78,local_c38);
  String::operator+(&local_c58,&local_c60);
  printToDebugConsole(&local_c58);
  String::~String(&local_c58);
  String::~String(&local_c78);
  String::~String(&local_c60);
  String::~String(&local_c70);
  String::~String(&local_c68);
  return;
}

Assistant:

void logAssertNothrow(bool threw, const char* expr, assertType::Enum assert_type,
                          const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(!threw)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED!\n");

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s )\n\n",
                         getAssertString(assert_type), expr);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, !threw ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }